

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.h
# Opt level: O3

void __thiscall xLearn::Predictor::~Predictor(Predictor *this)

{
  pointer pfVar1;
  pointer pcVar2;
  
  pfVar1 = (this->out_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pcVar2 = (this->out_file_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->out_file_).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~Predictor() { }